

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FArchive::WriteName(FArchive *this,char *name)

{
  DWORD count;
  BYTE id;
  
  if (name == (char *)0x0) {
    id = '!';
    (*this->_vptr_FArchive[2])(this,&id,1);
  }
  else {
    count = FindName(this,name);
    if (count == 0xffffffff) {
      AddName(this,name);
      id = '\x1b';
      (*this->_vptr_FArchive[2])(this,&id,1);
      WriteString(this,name);
    }
    else {
      id = '\x1c';
      (*this->_vptr_FArchive[2])(this,&id,1);
      WriteCount(this,count);
    }
  }
  return;
}

Assistant:

void FArchive::WriteName (const char *name)
{
	BYTE id;

	if (name == NULL)
	{
		id = NIL_NAME;
		Write (&id, 1);
	}
	else
	{
		DWORD index = FindName (name);
		if (index != NameMap::NO_INDEX)
		{
			id = OLD_NAME;
			Write (&id, 1);
			WriteCount (index);
		}
		else
		{
			AddName (name);
			id = NEW_NAME;
			Write (&id, 1);
			WriteString (name);
		}
	}
}